

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O2

type __thiscall
dg::pta::PointerGraph::nodeFactory<(dg::pta::PSNodeType)2,dg::pta::PSNode*&,dg::pta::PSNode>
          (PointerGraph *this,PSNode **args)

{
  int iVar1;
  PSNode *this_00;
  
  this_00 = (PSNode *)operator_new(0xe8);
  iVar1 = *(int *)(this + 0x40);
  *(IDType *)(this + 0x40) = iVar1 + 1U;
  PSNode::PSNode<dg::pta::PSNode*&>(this_00,iVar1 + 1U,LOAD,args);
  return this_00;
}

Assistant:

typename std::enable_if<std::is_same<Node, PSNode>::value, Node *>::type
    nodeFactory(Args &&...args) {
        static_assert(expected_args_size<Type, sizeof...(args)>() ==
                              sizeof...(args),
                      "Incorrect number of arguments");
        return new Node(getNewNodeId(), Type, std::forward<Args>(args)...);
    }